

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgx_enc.c
# Opt level: O2

int pgx_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  jas_image_cmpt_t *pjVar1;
  uchar *puVar2;
  _Bool _Var3;
  uint_fast32_t uVar4;
  uint cmptno;
  int iVar5;
  jas_matrix_t *data;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  pgx_hdr_t local_70;
  ulong local_48;
  ulong local_40;
  jas_image_t *local_38;
  
  if ((image->clrspc_ & 0xffffff00U) == 0x300) {
    cmptno = jas_image_getcmptbytype(image,0);
    if ((int)cmptno < 0) {
      pcVar10 = "error: missing color component\n";
    }
    else {
      if (image->numcmpts_ < 2) {
        pjVar1 = image->cmpts_[cmptno];
        if (pjVar1->prec_ < 0x11) {
          local_70.sgnd = pjVar1->sgnd_ != 0;
          local_70.magic = 0x5047;
          local_70.bigendian = true;
          local_70.prec = (uint_fast32_t)pjVar1->prec_;
          local_70.width = pjVar1->width_;
          local_70.height = pjVar1->height_;
          iVar5 = jas_getdbglevel();
          uVar12 = 0x5047;
          if (9 < iVar5) {
            pgx_dumphdr(_stderr,&local_70);
            uVar12 = local_70.magic;
          }
          jas_stream_printf(out,"%c%c",uVar12 >> 8,uVar12 & 0xff);
          pcVar10 = "PLM";
          if (local_70.bigendian != false) {
            pcVar10 = "XML";
          }
          pcVar7 = "+";
          if (local_70.sgnd != false) {
            pcVar7 = "-";
          }
          jas_stream_printf(out," %s %s %d %ld %ld\n",pcVar10 + 1,pcVar7,local_70.prec,
                            local_70.width,local_70.height);
          if ((out->flags_ & 2) != 0) {
            return -1;
          }
          data = jas_matrix_create(1,local_70.width);
          if (data == (jas_matrix_t *)0x0) {
            return -1;
          }
          uVar12 = 0;
          local_38 = image;
          do {
            uVar4 = local_70.height;
            if ((local_70.height <= uVar12) ||
               (iVar5 = jas_image_readcmpt(local_38,cmptno,0,uVar12,local_70.width,1,data),
               iVar5 != 0)) {
              iVar5 = -(uint)(uVar12 < uVar4);
LAB_00131d9a:
              jas_matrix_destroy(data);
              return iVar5;
            }
            uVar9 = 0;
            local_48 = uVar12;
            while (_Var3 = local_70.bigendian, uVar9 < local_70.width) {
              uVar11 = 0;
              uVar8 = 1 << ((byte)local_70.prec & 0x1f);
              if (local_70.sgnd == false) {
                uVar8 = 0;
              }
              uVar8 = ~(-1 << ((byte)local_70.prec & 0x1f)) &
                      (int)(*data->rows_)[uVar9] + ((uint)((*data->rows_)[uVar9] >> 0x3f) & uVar8);
              uVar12 = (long)((int)local_70.prec + 7) / 8;
              uVar14 = uVar12 & 0xffffffff;
              uVar15 = 0;
              local_40 = uVar9;
              if (0 < (int)uVar12) {
                uVar15 = uVar12 & 0xffffffff;
              }
              while( true ) {
                uVar13 = (int)uVar14 - 1;
                uVar14 = (ulong)uVar13;
                if ((uint)uVar15 == uVar11) break;
                uVar6 = uVar11;
                if (_Var3 != false) {
                  uVar6 = uVar13;
                }
                if ((out->flags_ & 7U) != 0) {
LAB_00131d91:
                  iVar5 = -1;
                  goto LAB_00131d9a;
                }
                if ((-1 < out->rwlimit_) && (out->rwlimit_ <= out->rwcnt_)) {
                  out->flags_ = out->flags_ | 4;
                  goto LAB_00131d91;
                }
                *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
                iVar5 = out->cnt_;
                out->cnt_ = iVar5 + -1;
                if (iVar5 < 1) {
                  iVar5 = jas_stream_flushbuf(out,uVar8 >> ((byte)(uVar6 << 3) & 0x3f) & 0xff);
                  if (iVar5 == -1) goto LAB_00131d91;
                }
                else {
                  out->rwcnt_ = out->rwcnt_ + 1;
                  puVar2 = out->ptr_;
                  out->ptr_ = puVar2 + 1;
                  *puVar2 = (uchar)(uVar8 >> ((byte)(uVar6 << 3) & 0x3f));
                }
                uVar11 = uVar11 + 1;
              }
              uVar9 = local_40 + 1;
            }
            uVar12 = local_48 + 1;
          } while( true );
        }
      }
      pcVar10 = "The PGX format cannot be used to represent an image with this geometry.\n";
    }
  }
  else {
    pcVar10 = "error: PGX format does not support color space\n";
  }
  jas_eprintf(pcVar10);
  return -1;
}

Assistant:

int pgx_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	pgx_hdr_t hdr;
	uint_fast32_t width;
	uint_fast32_t height;
	bool sgnd;
	int prec;
	pgx_enc_t encbuf;
	pgx_enc_t *enc = &encbuf;

	/* Avoid compiler warnings about unused parameters. */
	(void)optstr;

	switch (jas_clrspc_fam(jas_image_clrspc(image))) {
	case JAS_CLRSPC_FAM_GRAY:
		if ((enc->cmpt = jas_image_getcmptbytype(image,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y))) < 0) {
			jas_eprintf("error: missing color component\n");
			return -1;
		}
		break;
	default:
		jas_eprintf("error: PGX format does not support color space\n");
		return -1;
		break;
	}

	width = jas_image_cmptwidth(image, enc->cmpt);
	height = jas_image_cmptheight(image, enc->cmpt);
	prec = jas_image_cmptprec(image, enc->cmpt);
	sgnd = jas_image_cmptsgnd(image, enc->cmpt);

	/* The PGX format is quite limited in the set of image geometries
	  that it can handle.  Here, we check to ensure that the image to
	  be saved can actually be represented reasonably accurately using the
	  PGX format. */
	/* There must be exactly one component. */
	if (jas_image_numcmpts(image) > 1 || prec > 16) {
		jas_eprintf("The PGX format cannot be used to represent an image with this geometry.\n");
		return -1;
	}

	hdr.magic = PGX_MAGIC;
	hdr.bigendian = true;
	hdr.sgnd = sgnd;
	hdr.prec = prec;
	hdr.width = width;
	hdr.height = height;

	if (jas_getdbglevel() >= 10) {
		pgx_dumphdr(stderr, &hdr);
	}

	if (pgx_puthdr(out, &hdr)) {
		return -1;
	}

	if (pgx_putdata(out, &hdr, image, enc->cmpt)) {
		return -1;
	}

	return 0;
}